

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O2

string * __thiscall
vkt::pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
          *specConstants)

{
  ulong uVar1;
  ostream *poVar2;
  uint *value;
  string local_1e8;
  string decl;
  ostringstream code;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&code);
  for (value = *(uint **)this; value != *(uint **)(this + 8); value = value + 0xe) {
    std::__cxx11::string::string((string *)&decl,(string *)(value + 2));
    uVar1 = std::__cxx11::string::find((char *)&decl,0x97c600);
    if (uVar1 != 0xffffffffffffffff) {
      de::toString<unsigned_int>(&local_1e8,value);
      std::__cxx11::string::replace((ulong)&decl,uVar1,(string *)0x5);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    poVar2 = std::operator<<((ostream *)&code,(string *)&decl);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&decl);
  }
  std::operator<<((ostream *)&code,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&code);
  return __return_storage_ptr__;
}

Assistant:

std::string generateSpecConstantCode (const std::vector<SpecConstant>& specConstants)
{
	std::ostringstream code;
	for (std::vector<SpecConstant>::const_iterator it = specConstants.begin(); it != specConstants.end(); ++it)
	{
		std::string decl = it->declarationCode;
		const std::string::size_type pos = decl.find("${ID}");
		if (pos != std::string::npos)
			decl.replace(pos, 5, de::toString(it->specID));
		code << decl << "\n";
	}
	code << "\n";
	return code.str();
}